

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O0

ma_result ma_paged_audio_buffer_data_init
                    (ma_format format,ma_uint32 channels,ma_paged_audio_buffer_data *pData)

{
  ma_paged_audio_buffer_data *pData_local;
  ma_uint32 channels_local;
  ma_format format_local;
  
  if (pData == (ma_paged_audio_buffer_data *)0x0) {
    channels_local = 0xfffffffe;
  }
  else {
    memset(pData,0,0x28);
    pData->format = format;
    pData->channels = channels;
    pData->pTail = &pData->head;
    channels_local = 0;
  }
  return channels_local;
}

Assistant:

MA_API ma_result ma_paged_audio_buffer_data_init(ma_format format, ma_uint32 channels, ma_paged_audio_buffer_data* pData)
{
    if (pData == NULL) {
        return MA_INVALID_ARGS;
    }

    MA_ZERO_OBJECT(pData);

    pData->format   = format;
    pData->channels = channels;
    pData->pTail    = &pData->head;

    return MA_SUCCESS;
}